

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdCreateAddress(void *handle,int hash_type,char *pubkey,char *redeem_script,int network_type,
                    char **address,char **locking_script,char **p2sh_segwit_locking_script)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  char *in_RDX;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  ElementsAddressFactory factory_1;
  Script *in_stack_000003e8;
  Script *in_stack_000003f0;
  Pubkey *in_stack_000003f8;
  AddressType in_stack_00000404;
  AddressFactory *in_stack_00000408;
  Script *in_stack_00000420;
  AddressFactory factory;
  Script unlocking_script;
  Script lock_script;
  Script script;
  Pubkey pubkey_obj;
  AddressType addr_type;
  Address addr;
  NetType net_type;
  bool is_bitcoin;
  char *work_p2sh_segwit_locking_script;
  char *work_locking_script;
  char *work_address;
  int result;
  undefined8 in_stack_fffffffffffff758;
  NetType type;
  Address *in_stack_fffffffffffff760;
  string *in_stack_fffffffffffff770;
  CfdError in_stack_fffffffffffff77c;
  CfdException *in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff798;
  NetType type_00;
  allocator *in_stack_fffffffffffff7a0;
  bool *in_stack_fffffffffffff7b8;
  string *in_stack_fffffffffffff7c0;
  string local_808;
  string local_7e8;
  string local_7c8;
  Address local_7a8;
  Address local_600;
  allocator local_451;
  string local_450;
  Script local_430;
  allocator local_3f1;
  string local_3f0;
  Pubkey local_3d0;
  string local_3b1;
  SchnorrPubkey local_390;
  ByteData local_378;
  allocator local_359;
  string local_358;
  ByteData local_338;
  ByteData local_320;
  Pubkey local_308;
  Script local_2f0;
  Script local_2b8;
  Script local_280;
  Pubkey local_248;
  AddressType local_22c;
  Address local_228;
  NetType local_a8;
  byte local_a3;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  char *local_28;
  char *local_20;
  int local_4;
  
  type_00 = (NetType)((ulong)in_stack_fffffffffffff798 >> 0x20);
  type = (NetType)((ulong)in_stack_fffffffffffff758 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  if (local_38 != (undefined8 *)0x0) {
    local_a3 = 0;
    local_a8 = cfd::capi::ConvertNetType
                         ((int)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8)
    ;
    cfd::core::Address::Address(&local_228);
    local_22c = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffff7c0 >> 0x20))
    ;
    cfd::core::Pubkey::Pubkey(&local_248);
    cfd::core::Script::Script(&local_280);
    cfd::core::Script::Script(&local_2b8);
    cfd::core::Script::Script(&local_2f0);
    if ((local_20 != (char *)0x0) && (*local_20 != '\0')) {
      if (local_22c == kTaprootAddress) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_358,"02",&local_359);
        cfd::core::ByteData::ByteData(&local_338,&local_358);
        in_stack_fffffffffffff7c0 = &local_3b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3b1.field_0x1,local_20,(allocator *)in_stack_fffffffffffff7c0);
        cfd::core::SchnorrPubkey::SchnorrPubkey(&local_390,(string *)&local_3b1.field_0x1);
        cfd::core::SchnorrPubkey::GetData(&local_378,&local_390);
        cfd::core::ByteData::Concat<cfd::core::ByteData>(&local_320,&local_338,&local_378);
        cfd::core::Pubkey::Pubkey(&local_308,&local_320);
        cfd::core::Pubkey::operator=(&local_248,&local_308);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5abe7d);
        cfd::core::ByteData::~ByteData((ByteData *)0x5abe8a);
        cfd::core::ByteData::~ByteData((ByteData *)0x5abe97);
        cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5abea4);
        std::__cxx11::string::~string((string *)&local_3b1.field_0x1);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
        cfd::core::ByteData::~ByteData((ByteData *)0x5abecb);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator((allocator<char> *)&local_359);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3f0,local_20,&local_3f1);
        cfd::core::Pubkey::Pubkey(&local_3d0,&local_3f0);
        cfd::core::Pubkey::operator=(&local_248,&local_3d0);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5ac0f5);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      }
    }
    if ((local_28 != (char *)0x0) && (*local_28 != '\0')) {
      in_stack_fffffffffffff7a0 = &local_451;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_450,local_28,in_stack_fffffffffffff7a0);
      type_00 = (NetType)((ulong)local_28 >> 0x20);
      cfd::core::Script::Script(&local_430,&local_450);
      cfd::core::Script::operator=(&local_280,&local_430);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff760);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
    }
    if ((local_a3 & 1) == 0) {
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)in_stack_fffffffffffff7a0,type_00);
      cfd::AddressFactory::CreateAddress
                (in_stack_00000408,in_stack_00000404,in_stack_000003f8,in_stack_000003f0,
                 in_stack_000003e8,in_stack_00000420);
      cfd::core::Address::operator=(&local_228,&local_7a8);
      cfd::core::Address::~Address(in_stack_fffffffffffff760);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5ac428);
    }
    else {
      cfd::AddressFactory::AddressFactory((AddressFactory *)in_stack_fffffffffffff760,type);
      cfd::AddressFactory::CreateAddress
                (in_stack_00000408,in_stack_00000404,in_stack_000003f8,in_stack_000003f0,
                 in_stack_000003e8,in_stack_00000420);
      cfd::core::Address::operator=(&local_228,&local_600);
      cfd::core::Address::~Address(in_stack_fffffffffffff760);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x5ac336);
    }
    cfd::core::Address::GetAddress_abi_cxx11_(&local_7c8,&local_228);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffff7c0);
    std::__cxx11::string::~string((string *)&local_7c8);
    if ((in_stack_00000008 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Script::IsEmpty(&local_2b8), !bVar1)) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_7e8,&local_2b8);
      local_50 = cfd::capi::CreateString(in_stack_fffffffffffff7c0);
      std::__cxx11::string::~string((string *)&local_7e8);
    }
    if ((in_stack_00000010 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Script::IsEmpty(&local_2f0), !bVar1)) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_808,&local_2f0);
      local_58 = cfd::capi::CreateString(in_stack_fffffffffffff7c0);
      std::__cxx11::string::~string((string *)&local_808);
    }
    *local_38 = local_48;
    if (local_50 != (char *)0x0) {
      *in_stack_00000008 = local_50;
    }
    if (local_58 != (char *)0x0) {
      *in_stack_00000010 = local_58;
    }
    local_4 = 0;
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff760);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff760);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff760);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x5ac6a6);
    cfd::core::Address::~Address(in_stack_fffffffffffff760);
    return local_4;
  }
  local_80.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_address.cpp"
               ,0x2f);
  local_80.filename = local_80.filename + 1;
  local_80.line = 0x8f;
  local_80.funcname = "CfdCreateAddress";
  cfd::core::logger::warn<>(&local_80,"address is null.");
  local_a2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"Failed to parameter. address is null.",&local_a1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff780,in_stack_fffffffffffff77c,in_stack_fffffffffffff770);
  local_a2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateAddress(
    void* handle, int hash_type, const char* pubkey, const char* redeem_script,
    int network_type, char** address, char** locking_script,
    char** p2sh_segwit_locking_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_locking_script = nullptr;
  char* work_p2sh_segwit_locking_script = nullptr;
  try {
    cfd::Initialize();
    if (address == nullptr) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    Address addr;
    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Pubkey pubkey_obj;
    Script script;
    Script lock_script;
    Script unlocking_script;

    if ((pubkey != nullptr) && (*pubkey != '\0')) {
      if (addr_type == AddressType::kTaprootAddress) {
        pubkey_obj =
            Pubkey(ByteData("02").Concat(SchnorrPubkey(pubkey).GetData()));
      } else {
        pubkey_obj = Pubkey(pubkey);
      }
    }
    if ((redeem_script != nullptr) && (*redeem_script != '\0')) {
      script = Script(redeem_script);
    }

    if (is_bitcoin) {
      AddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    work_address = CreateString(addr.GetAddress());
    if (locking_script != nullptr) {
      if (!lock_script.IsEmpty()) {
        work_locking_script = CreateString(lock_script.GetHex());
      }
    }
    if (p2sh_segwit_locking_script != nullptr) {
      if (!unlocking_script.IsEmpty()) {
        work_p2sh_segwit_locking_script =
            CreateString(unlocking_script.GetHex());
      }
    }

    *address = work_address;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_p2sh_segwit_locking_script != nullptr)
      *p2sh_segwit_locking_script = work_p2sh_segwit_locking_script;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_address, &work_locking_script, &work_p2sh_segwit_locking_script);
  return result;
}